

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ParsePurpose(AsciiParser *this,Purpose *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  size_type *psVar6;
  string str;
  ostringstream ss_e;
  string local_1f8;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  if ((result == (Purpose *)0x0) || (bVar2 = SkipCommentAndWhitespaceAndNewline(this,true), !bVar2))
  {
    return false;
  }
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  bVar2 = ReadIdentifier(this,&local_1d8);
  if (bVar2) {
    iVar3 = ::std::__cxx11::string::compare((char *)&local_1d8);
    if (iVar3 == 0) {
      *result = Default;
    }
    else {
      iVar3 = ::std::__cxx11::string::compare((char *)&local_1d8);
      if (iVar3 == 0) {
        *result = Render;
      }
      else {
        iVar3 = ::std::__cxx11::string::compare((char *)&local_1d8);
        if (iVar3 == 0) {
          *result = Proxy;
        }
        else {
          iVar3 = ::std::__cxx11::string::compare((char *)&local_1d8);
          if (iVar3 != 0) {
            ::std::__cxx11::ostringstream::ostringstream(local_198);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_198,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                       ,0x5f);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[ASCII]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_198,"ParsePurpose",0xc);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
            poVar4 = (ostream *)::std::ostream::operator<<(local_198,0x7ff);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            ::std::operator+(&local_1b8,"Invalid purpose value: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1d8);
            plVar5 = (long *)::std::__cxx11::string::append((char *)&local_1b8);
            paVar1 = &local_1f8.field_2;
            psVar6 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_1f8.field_2._M_allocated_capacity = *psVar6;
              local_1f8.field_2._8_8_ = plVar5[3];
              local_1f8._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_1f8.field_2._M_allocated_capacity = *psVar6;
              local_1f8._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_1f8._M_string_length = plVar5[1];
            *plVar5 = (long)psVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_198,local_1f8._M_dataplus._M_p,
                                local_1f8._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != paVar1) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::stringbuf::str();
            PushError(this,&local_1f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != paVar1) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::ostringstream::~ostringstream(local_198);
            ::std::ios_base::~ios_base(local_128);
            goto LAB_003c620c;
          }
          *result = Guide;
        }
      }
    }
    bVar2 = true;
  }
  else {
LAB_003c620c:
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) {
    return bVar2;
  }
  operator_delete(local_1d8._M_dataplus._M_p,
                  CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                           local_1d8.field_2._M_local_buf[0]) + 1);
  return bVar2;
}

Assistant:

bool AsciiParser::ParsePurpose(Purpose *result) {
  if (!result) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  std::string str;
  if (!ReadIdentifier(&str)) {
    return false;
  }

  if (str == "\"default\"") {
    (*result) = Purpose::Default;
  } else if (str == "\"render\"") {
    (*result) = Purpose::Render;
  } else if (str == "\"proxy\"") {
    (*result) = Purpose::Proxy;
  } else if (str == "\"guide\"") {
    (*result) = Purpose::Guide;
  } else {
    PUSH_ERROR_AND_RETURN_TAG(kAscii, "Invalid purpose value: " + str + "\n");
  }

  return true;
}